

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# examples.cpp
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  vector<std::bitset<20UL>,_std::allocator<std::bitset<20UL>_>_> local_70;
  undefined1 local_48 [8];
  LargeGapGrayCode lggc;
  
  lggc.m_creationMethod.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  LargeGapGrayCode::LargeGapGrayCode((LargeGapGrayCode *)local_48);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "####################################################################");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "####### 1)  Printing statistics for all Large-Gap Gray Codes #######");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "####################################################################");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  LargeGapGrayCode::printAllStatistics((LargeGapGrayCode *)local_48);
  poVar1 = (ostream *)
           std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "####################################################################");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "#######  2)  Printing statistics for different 16-bit codes  #######");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "####################################################################");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  LargeGapGrayCode::printStatisticsHeader((LargeGapGrayCode *)local_48);
  LargeGapGrayCode::createCodeFromTheorem1((LargeGapGrayCode *)local_48,0xe,2,3,1);
  LargeGapGrayCode::printStatistics((LargeGapGrayCode *)local_48,0x10);
  LargeGapGrayCode::createCodeFromTheorem1((LargeGapGrayCode *)local_48,8,8,0x81,0x7f);
  LargeGapGrayCode::printStatistics((LargeGapGrayCode *)local_48,0x10);
  LargeGapGrayCode::createCodeFromTheorem1((LargeGapGrayCode *)local_48,9,7,0x41,0x3f);
  LargeGapGrayCode::printStatistics((LargeGapGrayCode *)local_48,0x10);
  LargeGapGrayCode::createCodeFromTheorem1((LargeGapGrayCode *)local_48,0xb,5,0x15,0xb);
  LargeGapGrayCode::printStatistics((LargeGapGrayCode *)local_48,0x10);
  poVar1 = (ostream *)
           std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "####################################################################");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "#######       3)  Printing generated 7-bit binary code       #######");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "#######             Note: MinGap = 5 and MaxGap = 11         #######");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cout,
                           "####################################################################");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  LargeGapGrayCode::getBinaryCode(&local_70,(LargeGapGrayCode *)local_48,7);
  printBinaryCode(&local_70,7);
  std::vector<std::bitset<20UL>,_std::allocator<std::bitset<20UL>_>_>::~vector(&local_70);
  lggc.m_creationMethod.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  LargeGapGrayCode::~LargeGapGrayCode((LargeGapGrayCode *)local_48);
  return lggc.m_creationMethod.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
}

Assistant:

int main() {
	LargeGapGrayCode lggc;
	std::cout << "####################################################################" << std::endl;
	std::cout << "####### 1)  Printing statistics for all Large-Gap Gray Codes #######" << std::endl;
	std::cout << "####################################################################" << std::endl << std::endl;
	lggc.printAllStatistics();

	std::cout << std::endl << std::endl;
	std::cout << "####################################################################" << std::endl;
	std::cout << "#######  2)  Printing statistics for different 16-bit codes  #######" << std::endl;
	std::cout << "####################################################################" << std::endl << std::endl;
	lggc.printStatisticsHeader();
	lggc.createCodeFromTheorem1(14, 2, 3, 1);
	lggc.printStatistics(16);
	lggc.createCodeFromTheorem1(8, 8, 129, 127);
	lggc.printStatistics(16);
	lggc.createCodeFromTheorem1(9, 7, 65, 63);
	lggc.printStatistics(16);
	lggc.createCodeFromTheorem1(11, 5, 21, 11);
	lggc.printStatistics(16);

	std::cout << std::endl << std::endl;
	std::cout << "####################################################################" << std::endl;
	std::cout << "#######       3)  Printing generated 7-bit binary code       #######" << std::endl;
	std::cout << "#######             Note: MinGap = 5 and MaxGap = 11         #######" << std::endl;
	std::cout << "####################################################################" << std::endl << std::endl;
	printBinaryCode(lggc.getBinaryCode(7), 7);

	return 0;
}